

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

gnode_t * adjust_assignment_expression
                    (gravity_parser_t *parser,gtoken_t tok,gnode_t *lnode,gnode_t *rnode)

{
  gtoken_s token;
  gravity_parser_t *parser_00;
  char *pcVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  gnode_t *local_c0;
  gnode_t *local_a0;
  gtoken_s local_70;
  gravity_lexer_t *local_48;
  gravity_lexer_t *lexer;
  gnode_t *duplicate;
  gnode_t *pgStack_30;
  gtoken_t t;
  gnode_t *rnode_local;
  gnode_t *lnode_local;
  gravity_parser_t *pgStack_18;
  gtoken_t tok_local;
  gravity_parser_t *parser_local;
  
  pgStack_30 = rnode;
  rnode_local = lnode;
  lnode_local._4_4_ = tok;
  pgStack_18 = parser;
  switch(tok) {
  case TOK_OP_MUL_ASSIGN:
    duplicate._4_4_ = TOK_OP_MUL;
    break;
  case TOK_OP_DIV_ASSIGN:
    duplicate._4_4_ = TOK_OP_DIV;
    break;
  case TOK_OP_REM_ASSIGN:
    duplicate._4_4_ = TOK_OP_REM;
    break;
  case TOK_OP_ADD_ASSIGN:
    duplicate._4_4_ = TOK_OP_ADD;
    break;
  case TOK_OP_SUB_ASSIGN:
    duplicate._4_4_ = TOK_OP_SUB;
    break;
  case TOK_OP_SHIFT_LEFT_ASSIGN:
    duplicate._4_4_ = TOK_OP_SHIFT_LEFT;
    break;
  case TOK_OP_SHIFT_RIGHT_ASSIGN:
    duplicate._4_4_ = TOK_OP_SHIFT_RIGHT;
    break;
  case TOK_OP_BIT_AND_ASSIGN:
    duplicate._4_4_ = TOK_OP_BIT_AND;
    break;
  case TOK_OP_BIT_OR_ASSIGN:
    duplicate._4_4_ = TOK_OP_BIT_OR;
    break;
  case TOK_OP_BIT_XOR_ASSIGN:
    duplicate._4_4_ = TOK_OP_BIT_XOR;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_parser.c"
                  ,0x484,
                  "gnode_t *adjust_assignment_expression(gravity_parser_t *, gtoken_t, gnode_t *, gnode_t *)"
                 );
  }
  lexer = (gravity_lexer_t *)gnode_duplicate(lnode,true);
  parser_00 = pgStack_18;
  if (lexer == (gravity_lexer_t *)0x0) {
    local_48 = pgStack_18->lexer->p[pgStack_18->lexer->n - 1];
    gravity_lexer_token(&local_70,local_48);
    pcVar1 = token_name(lnode_local._4_4_);
    token.lineno = local_70.lineno;
    token.type = local_70.type;
    token.colno = local_70.colno;
    token.position = local_70.position;
    token.bytes = local_70.bytes;
    token.length = local_70.length;
    token.fileid = local_70.fileid;
    token.builtin = local_70.builtin;
    token.value = local_70.value;
    report_error(parser_00,GRAVITY_ERROR_SYNTAX,token,"An unexpected error occurred in %s",pcVar1,
                 in_R8,in_R9);
    parser_local = (gravity_parser_t *)0x0;
  }
  else {
    if (pgStack_18->declarations->n == 0) {
      local_a0 = (gnode_t *)0x0;
    }
    else {
      local_a0 = pgStack_18->declarations->p[pgStack_18->declarations->n - 1];
    }
    pgStack_30 = gnode_binary_expr_create(duplicate._4_4_,(gnode_t *)lexer,pgStack_30,local_a0);
    lnode_local._4_4_ = 0x45;
    if (pgStack_18->declarations->n == 0) {
      local_c0 = (gnode_t *)0x0;
    }
    else {
      local_c0 = pgStack_18->declarations->p[pgStack_18->declarations->n - 1];
    }
    parser_local = (gravity_parser_t *)
                   gnode_binary_expr_create(TOK_OP_ASSIGN,rnode_local,pgStack_30,local_c0);
  }
  return (gnode_t *)parser_local;
}

Assistant:

static gnode_t *adjust_assignment_expression (gravity_parser_t *parser, gtoken_t tok, gnode_t *lnode, gnode_t *rnode) {
    DEBUG_PARSER("adjust_assignment_expression");

    // called when tok is an assignment != TOK_OP_ASSIGN
    // convert expressions:
    // a += 1    => a = a + 1
    // a -= 1    => a = a - 1
    // a *= 1    => a = a * 1
    // a /= 1    => a = a / 1
    // a %= 1    => a = a % 1
    // a <<=1    => a = a << 1
    // a >>=1    => a = a >> 1
    // a &= 1    => a = a & 1
    // a |= 1    => a = a | 1
    // a ^= 1    => a = a ^ 1

    gtoken_t t;
    switch (tok) {
        case TOK_OP_MUL_ASSIGN: t = TOK_OP_MUL; break;
        case TOK_OP_DIV_ASSIGN: t = TOK_OP_DIV; break;
        case TOK_OP_REM_ASSIGN: t = TOK_OP_REM; break;
        case TOK_OP_ADD_ASSIGN: t = TOK_OP_ADD; break;
        case TOK_OP_SUB_ASSIGN: t = TOK_OP_SUB; break;
        case TOK_OP_SHIFT_LEFT_ASSIGN: t = TOK_OP_SHIFT_LEFT; break;
        case TOK_OP_SHIFT_RIGHT_ASSIGN: t = TOK_OP_SHIFT_RIGHT; break;
        case TOK_OP_BIT_AND_ASSIGN: t = TOK_OP_BIT_AND; break;
        case TOK_OP_BIT_OR_ASSIGN: t = TOK_OP_BIT_OR; break;
        case TOK_OP_BIT_XOR_ASSIGN: t = TOK_OP_BIT_XOR; break;

        // should never reach this point
        default: assert(0); break;
    }

    // duplicate node is mandatory here, otherwise the deallocator will try to free memory occopied by the same node twice
    gnode_t *duplicate = gnode_duplicate(lnode, true);
    if (!duplicate) {DECLARE_LEXER; REPORT_ERROR(gravity_lexer_token(lexer), "An unexpected error occurred in %s", token_name(tok)); return NULL;}
    rnode = gnode_binary_expr_create(t, duplicate, rnode, LAST_DECLARATION());
    tok = TOK_OP_ASSIGN;

    // its an assignment expression so switch the order
    return gnode_binary_expr_create(tok, lnode, rnode, LAST_DECLARATION());
}